

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::genProductString_abi_cxx11_
          (CppGenerator *this,TDNode *node,dyn_bitset *contributingViews,prod_bitset *product)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  size_t sVar4;
  ostream *poVar5;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  Attribute *pAVar6;
  ulong uVar7;
  string *in_RDX;
  string *in_RDI;
  View *incView;
  size_t incViewID;
  bool notFound;
  string *in_stack_000001c8;
  size_t v;
  CppGenerator *in_stack_000001d8;
  string freeVarString;
  var_bitset *functionVars;
  Function *function;
  size_t f;
  string *productString;
  size_t in_stack_fffffffffffffda8;
  QueryCompiler *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  TreeDecomposition *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdd0;
  Attribute *in_stack_fffffffffffffdd8;
  Attribute *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe10;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  reference local_110;
  View *local_100;
  ulong local_f8;
  byte local_e9;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  ulong local_88;
  allocator local_79;
  undefined1 local_78 [79];
  undefined1 local_29;
  string *local_18;
  
  local_29 = 0;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",(allocator *)(local_78 + 0x4e));
  std::allocator<char>::~allocator((allocator<char> *)(local_78 + 0x4e));
  local_78._48_8_ = (pointer)0x0;
  do {
    if ((pointer)0x5db < (ulong)local_78._48_8_) {
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::__cxx11::string::pop_back();
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI,"1");
      }
      return in_RDI;
    }
    bVar1 = std::bitset<1500UL>::operator[]
                      ((bitset<1500UL> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    if (bVar1) {
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2bf997);
      local_78._32_8_ =
           QueryCompiler::getFunction(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_78._40_8_ = local_78._32_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_78,"",&local_79);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      for (local_88 = 0; local_88 < 100; local_88 = local_88 + 1) {
        uVar2 = std::bitset<100UL>::operator[]
                          ((bitset<100UL> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        if ((bool)uVar2) {
          uVar3 = std::bitset<100UL>::operator[]
                            ((bitset<100UL> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
          if ((bool)uVar3) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
            std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2bfaa3);
            in_stack_fffffffffffffe08 =
                 TreeDecomposition::getAttribute
                           (in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
            std::operator+(in_stack_fffffffffffffdb8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffdb0);
            std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
            std::__cxx11::string::operator+=((string *)local_78,local_a8);
            std::__cxx11::string::~string(local_a8);
            std::__cxx11::string::~string(local_c8);
            std::__cxx11::string::~string(local_e8);
          }
          else {
            local_e9 = 1;
            local_f8 = 0;
            while( true ) {
              uVar7 = local_f8;
              std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2bfc57);
              sVar4 = QueryCompiler::numberOfViews((QueryCompiler *)0x2bfc5f);
              if (sVar4 <= uVar7) break;
              bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                      operator[]((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
              if (bVar1) {
                std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2bfcb2);
                local_100 = QueryCompiler::getView
                                      (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
                std::bitset<100UL>::operator[]
                          ((bitset<100UL> *)in_stack_fffffffffffffdb8,
                           (size_t)in_stack_fffffffffffffdb0);
                bVar1 = std::bitset::reference::operator_cast_to_bool
                                  ((reference *)in_stack_fffffffffffffdb0);
                std::bitset<100UL>::reference::~reference(&local_110);
                if (bVar1) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
                  std::
                  __shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2bfd69);
                  in_stack_fffffffffffffdd8 =
                       TreeDecomposition::getAttribute
                                 (in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
                  std::operator+(in_stack_fffffffffffffdb8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffdb0);
                  std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
                  std::__cxx11::string::operator+=((string *)local_78,local_130);
                  std::__cxx11::string::~string(local_130);
                  std::__cxx11::string::~string(local_150);
                  std::__cxx11::string::~string(local_170);
                  local_e9 = 0;
                  break;
                }
              }
              local_f8 = local_f8 + 1;
            }
            if ((local_e9 & 1) != 0) {
              std::operator<<((ostream *)&std::cerr,
                              "The loop hasn\'t been found - THIS IS A MISTAKE\n");
              poVar5 = std::operator<<((ostream *)&std::cout,local_18);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              this_00 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                                        CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffe10)),
                                        (bitset<1500UL> *)in_stack_fffffffffffffe08);
              std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
              std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2bff22);
              pAVar6 = TreeDecomposition::getAttribute
                                 (in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
              poVar5 = std::operator<<((ostream *)&std::cout,(string *)&pAVar6->_name);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              exit(1);
            }
          }
        }
      }
      in_stack_fffffffffffffdb0 = (QueryCompiler *)local_78;
      std::__cxx11::string::pop_back();
      getFunctionString(in_stack_000001d8,(Function *)v,in_stack_000001c8);
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=((string *)in_RDI,local_190);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::string::~string((string *)local_78);
    }
    local_78._48_8_ = local_78._48_8_ + 1;
  } while( true );
}

Assistant:

std::string CppGenerator::genProductString(
    const TDNode& node, const dyn_bitset& contributingViews, const prod_bitset& product)
{
    std::string productString = "";
    // Turn each function into string
    for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
    {
        if (product[f])
        {
            Function* function = _qc->getFunction(f);
            const var_bitset& functionVars = function->_fVars;

            std::string freeVarString = "";

            for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
            {                        
                if (functionVars[v])
                {
                    if (node._bag[v])
                    {
                        freeVarString += node._name+"Tuple."+
                            _td->getAttribute(v)->_name+",";                            
                    }
                    else
                    {
                        bool notFound = true;
                        for (size_t incViewID = 0; incViewID <
                                 _qc->numberOfViews(); ++incViewID)
                        {
                            if (contributingViews[incViewID])
                            {
                                View* incView = _qc->getView(incViewID);

                                if (incView->_fVars[v])
                                {
                                    freeVarString += viewName[incViewID]+"Tuple."+
                                        _td->getAttribute(v)->_name+",";
                                    notFound = false;
                                    break;
                                }                  
                            }
                        }

                        if (notFound)
                        {
                            ERROR("The loop hasn't been found - THIS IS A MISTAKE\n");
                            std::cout << node._name << std::endl;
                            std::cout << product << std::endl;
                            std::cout << _td->getAttribute(v)->_name << std::endl;
                            exit(1);
                        }
                    }
                }
            }

            freeVarString.pop_back();
            productString += getFunctionString(function,freeVarString)+"*";
        }
    }
            
    if (!productString.empty())
        productString.pop_back();
    else
        productString += "1";
    
    return productString;    
}